

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteTranslational::ArchiveIN
          (ChLinkRevoluteTranslational *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  double *local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkRevoluteTranslational>(marchive);
  ChLink::ArchiveIN(&this->super_ChLink,marchive);
  local_38 = &this->m_p1;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "m_p1";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_p2;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "m_p2";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_z1;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "m_z1";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_x2;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "m_x2";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_y2;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "m_y2";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_50 = &this->m_dist;
  local_58 = "m_dist";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  return;
}

Assistant:

void ChLinkRevoluteTranslational::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkRevoluteTranslational>();

    // deserialize parent class
    ChLink::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(m_p1);
    marchive >> CHNVP(m_p2);
    marchive >> CHNVP(m_z1);
    marchive >> CHNVP(m_x2);
    marchive >> CHNVP(m_y2);
    marchive >> CHNVP(m_dist);
}